

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_la.cxx
# Opt level: O2

void __thiscall xray_re::se_safe::state_read(se_safe *this,xr_packet *packet,uint16_t size)

{
  unsigned_short uVar1;
  bool bVar2;
  
  cse_alife_object_physic::state_read(&this->super_cse_alife_object_physic,packet,size);
  bVar2 = xr_packet::r_bool(packet);
  this->m_init_items_spawned = bVar2;
  bVar2 = xr_packet::r_bool(packet);
  this->m_safe_locked = bVar2;
  uVar1 = xr_packet::r<unsigned_short>(packet);
  this->m_count = uVar1;
  if (uVar1 == 0) {
    return;
  }
  __assert_fail("m_count == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_la.cxx"
                ,0x1a,"virtual void xray_re::se_safe::state_read(xr_packet &, uint16_t)");
}

Assistant:

void se_safe::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_object_physic::state_read(packet, size);
	m_init_items_spawned = packet.r_bool();
	m_safe_locked = packet.r_bool();
	m_count = packet.r_u16();
	xr_assert(m_count == 0);
}